

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashed.h
# Opt level: O0

void __thiscall
wasm::FunctionHasher::FunctionHasher(FunctionHasher *this,Map *output,ExprHasher *customHasher)

{
  ExprHasher *customHasher_local;
  Map *output_local;
  FunctionHasher *this_local;
  
  WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>::
  WalkerPass(&this->
              super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
            );
  (this->
  super_WalkerPass<wasm::PostWalker<wasm::FunctionHasher,_wasm::Visitor<wasm::FunctionHasher,_void>_>_>
  ).super_Pass._vptr_Pass = (_func_int **)&PTR__FunctionHasher_02716ed0;
  this->output = output;
  std::function<bool_(wasm::Expression_*,_unsigned_long_&)>::function
            (&this->customHasher,customHasher);
  return;
}

Assistant:

FunctionHasher(Map* output, ExpressionAnalyzer::ExprHasher customHasher)
    : output(output), customHasher(customHasher) {}